

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void EOPLL_forceRefresh(EOPLL *opll)

{
  int local_14;
  int i;
  EOPLL *opll_local;
  
  if (opll != (EOPLL *)0x0) {
    for (local_14 = 0; local_14 < 9; local_14 = local_14 + 1) {
      set_patch(opll,local_14,opll->patch_number[local_14]);
    }
    for (local_14 = 0; local_14 < 0x12; local_14 = local_14 + 1) {
      request_update(opll->slot + local_14,0xff);
    }
  }
  return;
}

Assistant:

void EOPLL_forceRefresh(EOPLL *opll) {
  int i;

  if (opll == NULL)
    return;

  for (i = 0; i < 9; i++) {
    set_patch(opll, i, opll->patch_number[i]);
  }

  for (i = 0; i < 18; i++) {
    request_update(&opll->slot[i], UPDATE_ALL);
  }
}